

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  __node_base_ptr *this;
  uint index_00;
  Expression **ppEVar1;
  bool bVar2;
  bool bVar3;
  reference pTVar4;
  reference puVar5;
  Expression *pEVar6;
  reference pppEVar7;
  LocalSet *this_00;
  size_type sVar8;
  LocalGet *pLVar9;
  TupleExtract *pTVar10;
  reference ppEVar11;
  Type *pTVar12;
  RefAs *pRVar13;
  TupleMake *right;
  Block *pBVar14;
  reference puVar15;
  Type TVar16;
  size_t sVar17;
  reference pvVar18;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar19;
  optional<wasm::Type> type_00;
  bool local_2bb;
  bool local_282;
  _Node_iterator_base<unsigned_int,_false> _Stack_248;
  uint index_1;
  iterator __end2_4;
  iterator __begin2_4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2_4;
  undefined1 local_228 [12];
  uintptr_t local_218;
  ulong local_210;
  size_t size;
  size_t i;
  undefined1 local_1f8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Type validType;
  Type type_1;
  LocalSet *set;
  Expression **setp;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2_3;
  LocalGet *get;
  Expression **getp;
  iterator __end2_2;
  iterator __begin2_2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2_2;
  Builder builder;
  Type local_128;
  Type local_120;
  _Node_iterator_base<unsigned_int,_false> local_118;
  undefined1 local_110;
  Index local_f4;
  iterator iStack_f0;
  uint index;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  LocalStructuralDominance info;
  Type type;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  Type varType;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  bool hasNonNullable;
  Module *wasm_local;
  Function *func_local;
  
  bVar2 = FeatureSet::hasReferenceTypes(&wasm->features);
  if (bVar2) {
    bVar2 = false;
    __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&func->vars);
    varType.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&func->vars);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                       *)&varType), bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end2);
      __range3 = (Type *)pTVar4->id;
      join_0x00000010_0x00000000_ =
           (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::begin((Type *)&__range3);
      _type = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              wasm::Type::end((Type *)&__range3);
      while (bVar3 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                               ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                &__end3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         *)&type), bVar3) {
        pTVar12 = wasm::Type::Iterator::operator*
                            ((Iterator *)
                             &__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
        info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = pTVar12->id;
        bVar3 = wasm::Type::isNonNullable
                          ((Type *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
        if (bVar3) {
          bVar2 = true;
          break;
        }
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
      }
      __gnu_cxx::
      __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end2);
    }
    if (bVar2) {
      LocalStructuralDominance::LocalStructuralDominance
                ((LocalStructuralDominance *)&badIndexes._M_h._M_single_bucket,func,wasm,
                 NonNullableOnly);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range2_1);
      this = &badIndexes._M_h._M_single_bucket;
      __end2_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       this);
      iStack_f0 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      this);
      while (bVar2 = std::operator!=(&__end2_1,&stack0xffffffffffffff10), bVar2) {
        puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
        local_f4 = *puVar5;
        pVar19 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2_1,&local_f4);
        local_118._M_cur =
             (__node_type *)pVar19.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_110 = pVar19.second;
        local_120 = Function::getLocalType(func,local_f4);
        bVar2 = wasm::Type::isNonNullable(&local_120);
        local_282 = true;
        if (!bVar2) {
          local_128 = Function::getLocalType(func,local_f4);
          local_282 = wasm::Type::isTuple(&local_128);
        }
        if (local_282 == false) {
          __assert_fail("func->getLocalType(index).isNonNullable() || func->getLocalType(index).isTuple()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                        ,0x199,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
        bVar2 = Function::isParam(func,local_f4);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!func->isParam(index)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                        ,0x19a,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
      }
      bVar2 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range2_1);
      if (bVar2) {
        builder.wasm._4_4_ = 1;
      }
      else {
        Builder::Builder((Builder *)&__range2_2,wasm);
        FindAllPointers<wasm::LocalGet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalGet> *)&__begin2_2,&func->body);
        __end2_2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                             ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                              &__begin2_2);
        getp = (Expression **)
               std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                         ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                          &__begin2_2);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                   *)&getp), bVar2) {
          pppEVar7 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                     ::operator*(&__end2_2);
          ppEVar1 = *pppEVar7;
          pLVar9 = Expression::cast<wasm::LocalGet>(*ppEVar1);
          sVar8 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2_1,&pLVar9->index);
          if (sVar8 != 0) {
            pEVar6 = fixLocalGet(pLVar9,wasm);
            *ppEVar1 = pEVar6;
          }
          __gnu_cxx::
          __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
          ::operator++(&__end2_2);
        }
        builder.wasm._4_4_ = 8;
        FindAllPointers<wasm::LocalGet>::~FindAllPointers
                  ((FindAllPointers<wasm::LocalGet> *)&__begin2_2);
        FindAllPointers<wasm::LocalSet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalSet> *)&__begin2_3,&func->body);
        __end2_3 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                             ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                              &__begin2_3);
        setp = (Expression **)
               std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                         ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                          &__begin2_3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                   *)&setp), bVar2) {
          pppEVar7 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                     ::operator*(&__end2_3);
          ppEVar1 = *pppEVar7;
          this_00 = Expression::cast<wasm::LocalSet>(*ppEVar1);
          bVar2 = Function::isVar(func,this_00->index);
          if (bVar2) {
            bVar2 = LocalSet::isTee(this_00);
            local_2bb = true;
            if (bVar2) {
              type_1.id._4_4_ = 1;
              local_2bb = wasm::Type::operator==
                                    (&(this_00->super_SpecificExpression<(wasm::Expression::Id)9>).
                                      super_Expression.type,(BasicType *)((long)&type_1.id + 4));
            }
            if ((local_2bb == false) &&
               (sVar8 = std::
                        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&__range2_1,&this_00->index), sVar8 != 0)) {
              validType = Function::getLocalType(func,this_00->index);
              elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (wasm->features).features;
              TVar16 = getValidLocalType(validType,
                                         elems.
                                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              bVar2 = wasm::Type::isRef(&validType);
              if (bVar2) {
                (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.
                id = TVar16.id;
                pRVar13 = Builder::makeRefAs((Builder *)&__range2_2,RefAsNonNull,
                                             (Expression *)this_00);
                *ppEVar1 = (Expression *)pRVar13;
              }
              else {
                bVar2 = wasm::Type::isTuple(&validType);
                if (!bVar2) {
                  __assert_fail("type.isTuple()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                                ,0x1bd,
                                "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                               );
                }
                LocalSet::makeSet(this_00);
                sVar17 = wasm::Type::size(&validType);
                std::allocator<wasm::Expression_*>::allocator
                          ((allocator<wasm::Expression_*> *)((long)&i + 7));
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           local_1f8,sVar17,(allocator<wasm::Expression_*> *)((long)&i + 7));
                std::allocator<wasm::Expression_*>::~allocator
                          ((allocator<wasm::Expression_*> *)((long)&i + 7));
                size = 0;
                local_210 = wasm::Type::size(&validType);
                for (; size < local_210; size = size + 1) {
                  local_218 = TVar16.id;
                  pLVar9 = Builder::makeLocalGet((Builder *)&__range2_2,this_00->index,TVar16);
                  pTVar10 = Builder::makeTupleExtract
                                      ((Builder *)&__range2_2,(Expression *)pLVar9,(Index)size);
                  ppEVar11 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                             operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         *)local_1f8,size);
                  *ppEVar11 = (value_type)pTVar10;
                  pTVar12 = wasm::Type::operator[](&validType,size);
                  bVar2 = wasm::Type::isNonNullable(pTVar12);
                  if (bVar2) {
                    ppEVar11 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ::operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                             *)local_1f8,size);
                    pRVar13 = Builder::makeRefAs((Builder *)&__range2_2,RefAsNonNull,*ppEVar11);
                    ppEVar11 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ::operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                             *)local_1f8,size);
                    *ppEVar11 = (value_type)pRVar13;
                  }
                }
                right = Builder::
                        makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                  ((Builder *)&__range2_2,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)local_1f8);
                std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_228);
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)local_228._0_8_;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_228[8];
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._9_3_ = local_228._9_3_;
                pBVar14 = Builder::makeSequence
                                    ((Builder *)&__range2_2,(Expression *)this_00,
                                     (Expression *)right,type_00);
                *ppEVar1 = (Expression *)pBVar14;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           local_1f8);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
          ::operator++(&__end2_3);
        }
        builder.wasm._4_4_ = 10;
        FindAllPointers<wasm::LocalSet>::~FindAllPointers
                  ((FindAllPointers<wasm::LocalSet> *)&__begin2_3);
        __end2_4 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2_1);
        _Stack_248._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2_1);
        while (bVar2 = std::__detail::operator!=
                                 (&__end2_4.super__Node_iterator_base<unsigned_int,_false>,
                                  &stack0xfffffffffffffdb8), bVar2) {
          puVar15 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2_4);
          index_00 = *puVar15;
          TVar16 = Function::getLocalType(func,index_00);
          TVar16 = getValidLocalType(TVar16,(FeatureSet)(wasm->features).features);
          sVar17 = Function::getNumParams(func);
          pvVar18 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                              (&func->vars,index_00 - sVar17);
          pvVar18->id = TVar16.id;
          std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2_4);
        }
        builder.wasm._4_4_ = 0;
      }
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2_1);
      LocalStructuralDominance::~LocalStructuralDominance
                ((LocalStructuralDominance *)&badIndexes._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto varType : func->vars) {
    for (auto type : varType) {
      if (type.isNonNullable()) {
        hasNonNullable = true;
        break;
      }
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable() ||
           func->getLocalType(index).isTuple());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      auto validType = getValidLocalType(type, wasm.features);
      if (type.isRef()) {
        set->type = validType;
        *setp = builder.makeRefAs(RefAsNonNull, set);
      } else {
        assert(type.isTuple());
        set->makeSet();
        std::vector<Expression*> elems(type.size());
        for (size_t i = 0, size = type.size(); i < size; ++i) {
          elems[i] = builder.makeTupleExtract(
            builder.makeLocalGet(set->index, validType), i);
          if (type[i].isNonNullable()) {
            elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
          }
        }
        *setp =
          builder.makeSequence(set, builder.makeTupleMake(std::move(elems)));
      }
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}